

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetaEvent.cpp
# Opt level: O2

void __thiscall MIDI::MetaEvent::debug(MetaEvent *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"\tInvalid Meta Event 0x");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void MetaEvent::debug()
  { 
    cout << "\tInvalid Meta Event 0x" << setbase(16) << (unsigned int)_metaType << endl;
  }